

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

ForLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token openParen;
  Info *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  SyntaxNode *pSVar6;
  ExpressionSyntax *pEVar7;
  StatementSyntax *statement;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ForLoopStatementSyntax *pFVar8;
  __extent_storage<18446744073709551615UL> _Var9;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  TokenKind TVar10;
  NamedLabelSyntax *ctx;
  bool bVar11;
  Token forKeyword;
  Token TVar12;
  SourceRange range;
  Token TVar13;
  string_view syntaxName;
  Token local_268;
  Token local_258;
  ExpressionSyntax *local_248;
  Info *local_240;
  undefined8 local_238;
  NamedLabelSyntax *local_230;
  Info *local_228;
  undefined8 local_220;
  pointer local_218;
  size_t local_210;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_208;
  ulong local_1f8;
  undefined8 uStack_1f0;
  size_t local_1e8;
  pointer local_1e0;
  size_t local_1d8;
  Token semi2;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> steps;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> local_118;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> initializers;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_68;
  
  _Var9 = attributes._M_extent._M_extent_value;
  local_218 = attributes._M_ptr;
  local_230 = label;
  local_210 = _Var9._M_extent_value;
  TVar12 = ParserBase::consume(&this->super_ParserBase);
  local_240 = TVar12.info;
  local_238 = TVar12._0_8_;
  TVar12 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_228 = TVar12.info;
  local_220 = TVar12._0_8_;
  Token::Token(&local_268);
  initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  bVar4 = isVariableDeclaration(this);
  if (bVar4) {
    TVar12 = ParserBase::peek(&this->super_ParserBase);
    bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
    if (bVar4) {
      local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar4 = syntax::SyntaxFacts::isPossibleForInitializer(TVar12.kind);
      if (bVar4) {
        do {
          pSVar6 = parseForInitializer(this);
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pSVar6;
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               CONCAT71(steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&steps);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar13.kind);
          _Var9._M_extent_value._0_1_ = TVar13.kind != Comma || bVar4;
          if ((bool)_Var9._M_extent_value._0_1_) break;
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::expect(&this->super_ParserBase,Comma);
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&steps);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          TVar10 = TVar13.kind;
          bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar10);
          _Var9._M_extent_value._0_1_ = TVar10 != EndOfFile;
          if (TVar10 == EndOfFile || bVar4) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          bVar4 = TVar12.kind == TVar10;
          bVar11 = TVar12.info == TVar13.info;
          _Var9._M_extent_value._0_1_ = bVar11 && bVar4;
          TVar12 = TVar13;
        } while ((!bVar11 || !bVar4) ||
                (bVar4 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleForInitializer,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                   (&this->super_ParserBase,(DiagCode)0x3c0005,true), bVar4));
        local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      }
      else {
        _Var9._M_extent_value = 0x13;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar12,Semicolon,&local_268,(DiagCode)0x3c0005);
      }
    }
  }
  else {
    TVar12 = ParserBase::peek(&this->super_ParserBase);
    bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
    if (bVar4) {
      local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar4 = syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar12.kind);
      if (bVar4) {
        do {
          pSVar6 = &parseExpression(this)->super_SyntaxNode;
          if (pSVar6->kind != AssignmentExpression) {
            if (pSVar6->kind == IdentifierName) {
              TVar13 = syntax::SyntaxNode::getFirstToken(pSVar6);
              if ((TVar13._0_4_ >> 0x10 & 1) != 0) goto LAB_001d3dbe;
            }
            range = syntax::SyntaxNode::sourceRange(pSVar6);
            _Var9._M_extent_value = (size_t)range.endLoc;
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x6d0005,range);
          }
LAB_001d3dbe:
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pSVar6;
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               CONCAT71(steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&steps);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar13.kind);
          _Var9._M_extent_value._0_1_ = TVar13.kind != Comma || bVar4;
          if ((bool)_Var9._M_extent_value._0_1_) break;
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::expect(&this->super_ParserBase,Comma);
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&steps);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          TVar10 = TVar13.kind;
          bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar10);
          _Var9._M_extent_value._0_1_ = TVar10 != EndOfFile;
          if (TVar10 == EndOfFile || bVar4) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          bVar4 = TVar12.kind == TVar10;
          bVar11 = TVar12.info == TVar13.info;
          _Var9._M_extent_value._0_1_ = bVar11 && bVar4;
          TVar12 = TVar13;
        } while ((!bVar11 || !bVar4) ||
                (bVar4 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                   (&this->super_ParserBase,(DiagCode)0x3c0005,true), bVar4));
        local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      }
      else {
        _Var9._M_extent_value = 0x13;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar12,Semicolon,&local_268,(DiagCode)0x3c0005);
      }
    }
  }
  Token::Token(&semi2);
  bVar4 = ParserBase::peek(&this->super_ParserBase,Semicolon);
  if (bVar4) {
    semi2 = ParserBase::consume(&this->super_ParserBase);
    local_248 = (ExpressionSyntax *)0x0;
  }
  else {
    local_248 = parseExpression(this);
    semi2 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  Token::Token(&local_258);
  steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
  if (bVar4) {
    local_258 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar4 = syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar12.kind);
    if (bVar4) {
      do {
        pEVar7 = parseExpression(this);
        local_208._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar7;
        local_1f8 = CONCAT71(local_1f8._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_208._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        TVar10 = TVar13.kind;
        bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar10);
        _Var9._M_extent_value._0_1_ = TVar10 == EndOfFile || bVar4;
        if ((bool)_Var9._M_extent_value._0_1_) break;
        if (TVar10 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar4 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x10001,false);
            if (!bVar4) {
              local_258 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
              goto LAB_001d412f;
            }
            bVar4 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar4);
        }
        local_208._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1f8 = local_1f8 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_208._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        TVar10 = TVar13.kind;
        bVar4 = syntax::SyntaxFacts::isEndOfParenList(TVar10);
        _Var9._M_extent_value._0_1_ = TVar10 != EndOfFile;
        if (TVar10 == EndOfFile || bVar4) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        bVar4 = TVar12.kind == TVar10;
        bVar11 = TVar12.info == TVar13.info;
        _Var9._M_extent_value._0_1_ = bVar11 && bVar4;
        TVar12 = TVar13;
      } while ((!bVar11 || !bVar4) ||
              (bVar4 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                 (&this->super_ParserBase,(DiagCode)0x10001,true), bVar4));
      local_258 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    }
    else {
      _Var9._M_extent_value = 0x12;
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar12,CloseParenthesis,&local_258,(DiagCode)0x10001);
    }
  }
LAB_001d412f:
  statement = parseStatement(this,true,false);
  TVar12 = local_258;
  TVar13.info = (Info *)_Var9._M_extent_value;
  TVar13.kind = local_258.kind;
  TVar13._2_1_ = local_258._2_1_;
  TVar13.numFlags.raw = local_258.numFlags.raw;
  TVar13.rawLen = local_258.rawLen;
  syntaxName._M_str = "for loop";
  syntaxName._M_len = 8;
  local_258 = TVar12;
  checkEmptyBody(this,&statement->super_SyntaxNode,TVar13,syntaxName);
  uVar2 = local_220;
  pIVar1 = local_228;
  local_208._8_4_ = 1;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = local_210;
  local_1e0 = local_218;
  local_1d8 = local_210;
  local_208._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002da628;
  iVar5 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  TVar13 = semi2;
  TVar12 = local_268;
  local_118.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
  local_118.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_118.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_118.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_118.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002db248;
  iVar5 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
  uVar3 = local_220;
  local_68.elements._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar5);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002dacb0;
  openParen.info = pIVar1;
  local_220._0_2_ = (undefined2)uVar2;
  local_220._2_1_ = SUB81(uVar2,2);
  local_220._3_1_ = SUB81(uVar2,3);
  local_220._4_4_ = SUB84(uVar2,4);
  openParen.kind = (undefined2)local_220;
  openParen._2_1_ = local_220._2_1_;
  openParen.numFlags.raw = local_220._3_1_;
  openParen.rawLen = local_220._4_4_;
  forKeyword.info = local_240;
  forKeyword.kind = (undefined2)local_238;
  forKeyword._2_1_ = local_238._2_1_;
  forKeyword.numFlags.raw = local_238._3_1_;
  forKeyword.rawLen = local_238._4_4_;
  ctx = local_230;
  local_220 = uVar3;
  pFVar8 = syntax::SyntaxFactory::forLoopStatement
                     (&this->factory,local_230,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_208._M_first,
                      forKeyword,openParen,&local_118,TVar12,local_248,TVar13,&local_68,local_258,
                      statement);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)ctx);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)ctx);
  return pFVar8;
}

Assistant:

ForLoopStatementSyntax& Parser::parseForLoopStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto forKeyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token semi1;
    SmallVector<TokenOrSyntax, 4> initializers;

    if (isVariableDeclaration()) {
        parseList<isPossibleForInitializer, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] { return &parseForInitializer(); });
    }
    else {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] {
                auto& expr = parseExpression();
                if (expr.kind != SyntaxKind::AssignmentExpression &&
                    (expr.kind != SyntaxKind::IdentifierName ||
                     !expr.getFirstToken().isMissing())) {
                    // Initializer expressions must be variable assignments.
                    addDiag(diag::InvalidForInitializer, expr.sourceRange());
                }
                return &expr;
            });
    }

    ExpressionSyntax* stopExpr = nullptr;
    Token semi2;
    if (peek(TokenKind::Semicolon)) {
        semi2 = consume();
    }
    else {
        stopExpr = &parseExpression();
        semi2 = expect(TokenKind::Semicolon);
    }

    Token closeParen;
    SmallVector<TokenOrSyntax, 4> steps;
    parseList<isPossibleExpressionOrComma, isEndOfParenList>(
        steps, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedExpression, [this] { return &parseExpression(); });

    auto& body = parseStatement();

    checkEmptyBody(body, closeParen, "for loop"sv);

    return factory.forLoopStatement(label, attributes, forKeyword, openParen,
                                    initializers.copy(alloc), semi1, stopExpr, semi2,
                                    steps.copy(alloc), closeParen, body);
}